

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mgf_mask(uchar *dst,size_t dlen,uchar *src,size_t slen,mbedtls_md_context_t *md_ctx)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uchar counter [4];
  uchar mask [64];
  uchar local_8c [4];
  uchar *local_88;
  size_t local_80;
  byte local_78 [72];
  
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[8] = 0;
  local_78[9] = 0;
  local_78[10] = 0;
  local_78[0xb] = 0;
  local_78[0xc] = 0;
  local_78[0xd] = 0;
  local_78[0xe] = 0;
  local_78[0xf] = 0;
  local_78[0x10] = 0;
  local_78[0x11] = 0;
  local_78[0x12] = 0;
  local_78[0x13] = 0;
  local_78[0x14] = 0;
  local_78[0x15] = 0;
  local_78[0x16] = 0;
  local_78[0x17] = 0;
  local_78[0x18] = 0;
  local_78[0x19] = 0;
  local_78[0x1a] = 0;
  local_78[0x1b] = 0;
  local_78[0x1c] = 0;
  local_78[0x1d] = 0;
  local_78[0x1e] = 0;
  local_78[0x1f] = 0;
  local_78[0x20] = 0;
  local_78[0x21] = 0;
  local_78[0x22] = 0;
  local_78[0x23] = 0;
  local_78[0x24] = 0;
  local_78[0x25] = 0;
  local_78[0x26] = 0;
  local_78[0x27] = 0;
  local_78[0x28] = 0;
  local_78[0x29] = 0;
  local_78[0x2a] = 0;
  local_78[0x2b] = 0;
  local_78[0x2c] = 0;
  local_78[0x2d] = 0;
  local_78[0x2e] = 0;
  local_78[0x2f] = 0;
  local_78[0x30] = 0;
  local_78[0x31] = 0;
  local_78[0x32] = 0;
  local_78[0x33] = 0;
  local_78[0x34] = 0;
  local_78[0x35] = 0;
  local_78[0x36] = 0;
  local_78[0x37] = 0;
  local_78[0x38] = 0;
  local_78[0x39] = 0;
  local_78[0x3a] = 0;
  local_78[0x3b] = 0;
  local_78[0x3c] = 0;
  local_78[0x3d] = 0;
  local_78[0x3e] = 0;
  local_78[0x3f] = 0;
  local_8c[0] = '\0';
  local_8c[1] = '\0';
  local_8c[2] = '\0';
  local_8c[3] = '\0';
  local_88 = src;
  local_80 = slen;
  bVar1 = mbedtls_md_get_size(md_ctx->md_info);
  if (dlen != 0) {
    do {
      uVar4 = (ulong)bVar1;
      if (dlen < bVar1) {
        uVar4 = dlen;
      }
      iVar2 = mbedtls_md_starts(md_ctx);
      if ((((iVar2 != 0) || (iVar2 = mbedtls_md_update(md_ctx,local_88,local_80), iVar2 != 0)) ||
          (iVar2 = mbedtls_md_update(md_ctx,local_8c,4), iVar2 != 0)) ||
         (iVar2 = mbedtls_md_finish(md_ctx,local_78), iVar2 != 0)) goto LAB_0010e549;
      if (bVar1 != 0) {
        lVar3 = 0;
        do {
          dst[lVar3] = dst[lVar3] ^ local_78[lVar3];
          lVar3 = lVar3 + 1;
        } while (uVar4 + (uVar4 == 0) != lVar3);
        dst = dst + lVar3;
      }
      local_8c[3] = local_8c[3] + '\x01';
      dlen = dlen - uVar4;
    } while (dlen != 0);
  }
  iVar2 = 0;
LAB_0010e549:
  mbedtls_platform_zeroize(local_78,0x40);
  return iVar2;
}

Assistant:

static int mgf_mask( unsigned char *dst, size_t dlen, unsigned char *src,
                      size_t slen, mbedtls_md_context_t *md_ctx )
{
    unsigned char mask[MBEDTLS_MD_MAX_SIZE];
    unsigned char counter[4];
    unsigned char *p;
    unsigned int hlen;
    size_t i, use_len;
    int ret = 0;

    memset( mask, 0, MBEDTLS_MD_MAX_SIZE );
    memset( counter, 0, 4 );

    hlen = mbedtls_md_get_size( md_ctx->md_info );

    /* Generate and apply dbMask */
    p = dst;

    while( dlen > 0 )
    {
        use_len = hlen;
        if( dlen < hlen )
            use_len = dlen;

        if( ( ret = mbedtls_md_starts( md_ctx ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_update( md_ctx, src, slen ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_update( md_ctx, counter, 4 ) ) != 0 )
            goto exit;
        if( ( ret = mbedtls_md_finish( md_ctx, mask ) ) != 0 )
            goto exit;

        for( i = 0; i < use_len; ++i )
            *p++ ^= mask[i];

        counter[3]++;

        dlen -= use_len;
    }

exit:
    mbedtls_platform_zeroize( mask, sizeof( mask ) );

    return( ret );
}